

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib533.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  int *piVar5;
  char *pcVar6;
  timeval tVar7;
  timeval older;
  timeval older_00;
  int ec_11;
  CURLMcode ec_10;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  CURLMcode ec_9;
  CURLcode ec_8;
  CURLcode ec_7;
  CURLcode ec_6;
  int local_1fc;
  CURLMcode ec_5;
  int maxfd;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  timeval interval;
  CURLMcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_48;
  int local_3c;
  long lStack_38;
  int current;
  CURLM *m;
  long lStack_28;
  int running;
  CURL *curl;
  char *pcStack_18;
  int res;
  char *URL_local;
  
  curl._4_4_ = 0;
  lStack_28 = 0;
  lStack_38 = 0;
  local_3c = 0;
  pcStack_18 = URL;
  tVar7 = tutil_tvnow();
  _ec_1 = tVar7.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_48 = tVar7.tv_usec;
  tv_test_start.tv_usec = local_48;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                  ,0x2c,iVar2,uVar3);
    curl._4_4_ = iVar2;
  }
  if (curl._4_4_ == 0) {
    lStack_28 = curl_easy_init();
    if (lStack_28 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                    ,0x2e);
      curl._4_4_ = 0x7c;
    }
    if (curl._4_4_ == 0) {
      iVar2 = curl_easy_setopt(lStack_28,0x2712,pcStack_18);
      uVar1 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                      ,0x30,iVar2,uVar3);
        curl._4_4_ = iVar2;
      }
      if (curl._4_4_ == 0) {
        iVar2 = curl_easy_setopt(lStack_28,0x29,1);
        uVar1 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                        ,0x31,iVar2,uVar3);
          curl._4_4_ = iVar2;
        }
        if (curl._4_4_ == 0) {
          iVar2 = curl_easy_setopt(lStack_28,0x2d,1);
          uVar1 = _stderr;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                          ,0x32,iVar2,uVar3);
            curl._4_4_ = iVar2;
          }
          if (curl._4_4_ == 0) {
            lStack_38 = curl_multi_init();
            if (lStack_38 == 0) {
              curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                            ,0x34);
              curl._4_4_ = 0x7b;
            }
            if (curl._4_4_ == 0) {
              iVar2 = curl_multi_add_handle(lStack_38,lStack_28);
              uVar1 = _stderr;
              if (iVar2 != 0) {
                uVar3 = curl_multi_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                              ,0x36,iVar2,uVar3);
                curl._4_4_ = iVar2;
              }
              if (curl._4_4_ == 0) {
                curl_mfprintf(_stderr,"Start at URL 0\n");
                do {
                  local_1fc = -99;
                  rd.__fds_bits[0xf] = 1;
                  iVar2 = curl_multi_perform(lStack_38,(long)&m + 4);
                  uVar1 = _stderr;
                  if (iVar2 == 0) {
                    if (m._4_4_ < 0) {
                      curl_mfprintf(_stderr,
                                    "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                                    ,0x42,m._4_4_);
                      curl._4_4_ = 0x7a;
                    }
                  }
                  else {
                    uVar3 = curl_multi_strerror(iVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                                  ,0x42,iVar2,uVar3);
                    curl._4_4_ = iVar2;
                  }
                  if (curl._4_4_ != 0) break;
                  tVar7 = tutil_tvnow();
                  older.tv_usec = tv_test_start.tv_usec;
                  older.tv_sec = tv_test_start.tv_sec;
                  lVar4 = tutil_tvdiff(tVar7,older);
                  if (60000 < lVar4) {
                    curl_mfprintf(_stderr,
                                  "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                                  ,0x44);
                    curl._4_4_ = 0x7d;
                  }
                  if (curl._4_4_ != 0) break;
                  if (m._4_4_ == 0) {
                    if (local_3c != 0) break;
                    curl_mfprintf(_stderr,"Advancing to URL 1\n");
                    curl_multi_remove_handle(lStack_38,lStack_28);
                    curl_easy_reset(lStack_28);
                    iVar2 = curl_easy_setopt(lStack_28,0x2712,libtest_arg2);
                    uVar1 = _stderr;
                    if (iVar2 != 0) {
                      uVar3 = curl_easy_strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                                    ,0x4f,iVar2,uVar3);
                      curl._4_4_ = iVar2;
                    }
                    if (curl._4_4_ != 0) break;
                    iVar2 = curl_easy_setopt(lStack_28,0x29,1);
                    uVar1 = _stderr;
                    if (iVar2 != 0) {
                      uVar3 = curl_easy_strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                                    ,0x50,iVar2,uVar3);
                      curl._4_4_ = iVar2;
                    }
                    if (curl._4_4_ != 0) break;
                    iVar2 = curl_easy_setopt(lStack_28,0x2d,1);
                    uVar1 = _stderr;
                    if (iVar2 != 0) {
                      uVar3 = curl_easy_strerror(iVar2);
                      curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                                    ,0x51,iVar2,uVar3);
                      curl._4_4_ = iVar2;
                    }
                    if (curl._4_4_ != 0) break;
                    iVar2 = curl_multi_add_handle(lStack_38,lStack_28);
                    uVar1 = _stderr;
                    if (iVar2 != 0) {
                      uVar3 = curl_multi_strerror(iVar2);
                      curl_mfprintf(uVar1,
                                    "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                                    ,0x54,iVar2,uVar3);
                      curl._4_4_ = iVar2;
                    }
                    local_3c = local_3c + 1;
                    if (curl._4_4_ != 0) break;
                  }
                  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
                    wr.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
                  }
                  for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
                    exc.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
                  }
                  for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
                    (&ec_5 + (ulong)__arr_2._4_4_ * 2)[0] = CURLM_OK;
                    (&ec_5 + (ulong)__arr_2._4_4_ * 2)[1] = CURLM_OK;
                  }
                  iVar2 = curl_multi_fdset(lStack_38,wr.__fds_bits + 0xf,exc.__fds_bits + 0xf,&ec_5,
                                           &local_1fc);
                  uVar1 = _stderr;
                  if (iVar2 == 0) {
                    if (local_1fc < -1) {
                      curl_mfprintf(_stderr,
                                    "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                                    ,0x5e,local_1fc);
                      curl._4_4_ = 0x7a;
                    }
                  }
                  else {
                    uVar3 = curl_multi_strerror(iVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                                  ,0x5e,iVar2,uVar3);
                    curl._4_4_ = iVar2;
                  }
                  if (curl._4_4_ != 0) break;
                  iVar2 = select_wrapper(local_1fc + 1,(fd_set *)(wr.__fds_bits + 0xf),
                                         (fd_set *)(exc.__fds_bits + 0xf),(fd_set *)&ec_5,
                                         (timeval *)(rd.__fds_bits + 0xf));
                  if (iVar2 == -1) {
                    piVar5 = __errno_location();
                    uVar1 = _stderr;
                    iVar2 = *piVar5;
                    pcVar6 = strerror(iVar2);
                    curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                                  ,0x62,iVar2,pcVar6);
                    curl._4_4_ = 0x79;
                  }
                  if (curl._4_4_ != 0) break;
                  tVar7 = tutil_tvnow();
                  older_00.tv_usec = tv_test_start.tv_usec;
                  older_00.tv_sec = tv_test_start.tv_sec;
                  lVar4 = tutil_tvdiff(tVar7,older_00);
                  if (60000 < lVar4) {
                    curl_mfprintf(_stderr,
                                  "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/komeilkma[P]curl/tests/libtest/lib533.c"
                                  ,100);
                    curl._4_4_ = 0x7d;
                  }
                } while (curl._4_4_ == 0);
              }
            }
          }
        }
      }
    }
    curl_easy_cleanup(lStack_28);
    curl_multi_cleanup(lStack_38);
    curl_global_cleanup();
    URL_local._4_4_ = curl._4_4_;
  }
  else {
    URL_local._4_4_ = curl._4_4_;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl = NULL;
  int running;
  CURLM *m = NULL;
  int current = 0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);
  easy_setopt(curl, CURLOPT_FAILONERROR, 1L);

  multi_init(m);

  multi_add_handle(m, curl);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running) {
      if(!current++) {
        fprintf(stderr, "Advancing to URL 1\n");
        /* remove the handle we use */
        curl_multi_remove_handle(m, curl);

        /* make us re-use the same handle all the time, and try resetting
           the handle first too */
        curl_easy_reset(curl);
        easy_setopt(curl, CURLOPT_URL, libtest_arg2);
        easy_setopt(curl, CURLOPT_VERBOSE, 1L);
        easy_setopt(curl, CURLOPT_FAILONERROR, 1L);

        /* re-add it */
        multi_add_handle(m, curl);
      }
      else
        break; /* done */
    }

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* undocumented cleanup sequence - type UB */

  curl_easy_cleanup(curl);
  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}